

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FStringData::Dealloc(FStringData *this)

{
  FStringData *this_local;
  
  if (this->RefCount < 1) {
    free(this);
    return;
  }
  __assert_fail("RefCount <= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/zstring.cpp"
                ,0x4c2,"void FStringData::Dealloc()");
}

Assistant:

void FStringData::Dealloc ()
{
	assert (RefCount <= 0);

#ifdef _WIN32
	HeapFree (StringHeap, 0, this);
#else
	free (this);
#endif
}